

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

auto_ptr<cmCompiledGeneratorExpression> __thiscall
cmGeneratorExpression::Parse(cmGeneratorExpression *this,string *input)

{
  Snapshot snapshot;
  cmCompiledGeneratorExpression *this_00;
  string *in_RDX;
  PositionType local_98;
  Snapshot local_88;
  cmListFileBacktrace local_60;
  auto_ptr<cmCompiledGeneratorExpression> local_30;
  cmCompiledGeneratorExpression *local_28;
  string *local_20;
  string *input_local;
  cmGeneratorExpression *this_local;
  
  local_20 = in_RDX;
  input_local = input;
  this_local = this;
  this_00 = (cmCompiledGeneratorExpression *)operator_new(400);
  if (*(long *)input == 0) {
    cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_98);
    cmState::Snapshot::Snapshot(&local_88,(cmState *)0x0,local_98);
    snapshot.Position.Tree = local_88.Position.Tree;
    snapshot.State = local_88.State;
    snapshot.Position.Position = local_88.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_60,snapshot);
  }
  else {
    cmListFileBacktrace::cmListFileBacktrace(&local_60,*(cmListFileBacktrace **)input);
  }
  cmCompiledGeneratorExpression::cmCompiledGeneratorExpression(this_00,&local_60,local_20);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_30,this_00);
  local_28 = (cmCompiledGeneratorExpression *)
             cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_30);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)this,
             (auto_ptr_ref<cmCompiledGeneratorExpression>)local_28);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_30);
  cmListFileBacktrace::~cmListFileBacktrace(&local_60);
  return (auto_ptr<cmCompiledGeneratorExpression>)(cmCompiledGeneratorExpression *)this;
}

Assistant:

cmsys::auto_ptr<cmCompiledGeneratorExpression>
cmGeneratorExpression::Parse(std::string const& input)
{
  return cmsys::auto_ptr<cmCompiledGeneratorExpression>(
    new cmCompiledGeneratorExpression(
      this->Backtrace ? *this->Backtrace : cmListFileBacktrace(),
      input));
}